

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

int __thiscall
cmMakefile::ConfigureFile
          (cmMakefile *this,string *infile,string *outfile,bool copyonly,bool atOnly,
          bool escapeQuotes,cmNewLineStyle newLine)

{
  pointer pcVar1;
  bool bVar2;
  BOM BVar3;
  long lVar4;
  long *plVar5;
  ostream *poVar6;
  size_type *psVar7;
  uint uVar8;
  _Ios_Openmode _Var9;
  string outLine;
  mode_t perm;
  string tempOutputFile;
  string newLineCharacters;
  string path;
  string inLine;
  ofstream fout;
  string local_638;
  string local_618;
  mode_t local_5f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  char *local_5d0;
  char *local_5c8;
  char local_5c0;
  undefined7 uStack_5bf;
  string local_5b0;
  byte abStack_590 [488];
  undefined1 local_3a8 [112];
  ios_base local_338 [264];
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  bVar2 = CanIWriteThisFile(this,outfile);
  if (!bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   "Attempt to write file: ",outfile);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_230);
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_5b0.field_2._M_allocated_capacity = *psVar7;
      local_5b0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_5b0.field_2._M_allocated_capacity = *psVar7;
      local_5b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_5b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cmSystemTools::Error(&local_5b0);
LAB_001c8e8e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    return 0;
  }
  bVar2 = cmsys::SystemTools::FileExists(infile);
  if (!bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   "File ",infile);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_230);
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_5b0.field_2._M_allocated_capacity = *psVar7;
      local_5b0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_5b0.field_2._M_allocated_capacity = *psVar7;
      local_5b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_5b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cmSystemTools::Error(&local_5b0);
    goto LAB_001c8e8e;
  }
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  pcVar1 = (outfile->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_638,pcVar1,pcVar1 + outfile->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,infile);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_638);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->OutputFiles,&local_638);
  local_5f4 = 0;
  cmsys::SystemTools::GetPermissions(infile,&local_5f4);
  lVar4 = std::__cxx11::string::rfind((char)&local_638,0x2f);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&local_5b0,(ulong)&local_638);
    cmsys::SystemTools::MakeDirectory(&local_5b0,(mode_t *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (copyonly) {
    bVar2 = cmsys::SystemTools::CopyFileIfDifferent(infile,&local_638);
    uVar8 = 1;
    goto joined_r0x001c9227;
  }
  local_5d0 = &local_5c0;
  local_5c8 = (char *)0x0;
  local_5c0 = '\0';
  bVar2 = cmNewLineStyle::IsValid(&newLine);
  if (bVar2) {
    cmNewLineStyle::GetCharacters_abi_cxx11_(&local_5b0,&newLine);
    std::__cxx11::string::_M_assign((string *)&local_5d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    _Var9 = _S_trunc|_S_out|_S_bin;
  }
  else {
    _Var9 = _S_trunc|_S_out;
    std::__cxx11::string::_M_replace((ulong)&local_5d0,0,local_5c8,0x4dde69);
  }
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5f0,local_638._M_dataplus._M_p,
             local_638._M_dataplus._M_p + local_638._M_string_length);
  std::__cxx11::string::append((char *)&local_5f0);
  std::ofstream::ofstream(local_230,local_5f0._M_dataplus._M_p,_Var9);
  if ((abStack_210[*(long *)(local_230._0_8_ + -0x18)] & 5) == 0) {
    std::ifstream::ifstream(&local_5b0,(infile->_M_dataplus)._M_p,_S_in);
    if ((abStack_590[*(long *)(local_5b0._M_dataplus._M_p + -0x18)] & 5) == 0) {
      BVar3 = cmsys::FStream::ReadBOM((istream *)&local_5b0);
      if (BOM_UTF8 < BVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3a8,"File starts with a Byte-Order-Mark that is not UTF-8:\n  ",
                   0x38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3a8,(infile->_M_dataplus)._M_p,infile->_M_string_length);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,&local_618);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._M_dataplus._M_p != &local_618.field_2) {
          operator_delete(local_618._M_dataplus._M_p,
                          CONCAT71(local_618.field_2._M_allocated_capacity._1_7_,
                                   local_618.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
        std::ios_base::~ios_base(local_338);
        goto LAB_001c91a5;
      }
      std::istream::seekg(&local_5b0,0,0);
      local_3a8._0_8_ = local_3a8 + 0x10;
      local_3a8._8_8_ = 0;
      local_3a8[0x10] = '\0';
      local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
      local_618._M_string_length = 0;
      local_618.field_2._M_local_buf[0] = '\0';
      while (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&local_5b0,(string *)local_3a8,(bool *)0x0,-1), bVar2) {
        local_618._M_string_length = 0;
        *local_618._M_dataplus._M_p = '\0';
        ConfigureString(this,(string *)local_3a8,&local_618,atOnly,escapeQuotes);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,local_618._M_dataplus._M_p,
                            local_618._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_5d0,(long)local_5c8);
      }
      std::ifstream::close();
      std::ofstream::close();
      bVar2 = cmsys::SystemTools::CopyFileIfDifferent(&local_5f0,&local_638);
      if (bVar2) {
        cmsys::SystemTools::SetPermissions(&local_638,local_5f4,false);
      }
      uVar8 = (uint)bVar2;
      cmsys::SystemTools::RemoveFile(&local_5f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_dataplus._M_p != &local_618.field_2) {
        operator_delete(local_618._M_dataplus._M_p,
                        CONCAT71(local_618.field_2._M_allocated_capacity._1_7_,
                                 local_618.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
        operator_delete((void *)local_3a8._0_8_,CONCAT71(local_3a8._17_7_,local_3a8[0x10]) + 1);
      }
      bVar2 = true;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                     "Could not open file for read in copy operation ",infile);
      cmSystemTools::Error((string *)local_3a8);
      if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
        operator_delete((void *)local_3a8._0_8_,CONCAT71(local_3a8._17_7_,local_3a8[0x10]) + 1);
      }
LAB_001c91a5:
      uVar8 = 1;
      bVar2 = false;
    }
    std::ifstream::~ifstream(&local_5b0);
  }
  else {
    std::operator+(&local_5b0,"Could not open file for write in copy operation ",&local_5f0);
    cmSystemTools::Error(&local_5b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::ReportLastSystemError("");
    uVar8 = 1;
    bVar2 = false;
  }
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0,CONCAT71(uStack_5bf,local_5c0) + 1);
  }
joined_r0x001c9227:
  if (!bVar2) {
    uVar8 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p == &local_638.field_2) {
    return uVar8;
  }
  operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  return uVar8;
}

Assistant:

int cmMakefile::ConfigureFile(const std::string& infile,
                              const std::string& outfile, bool copyonly,
                              bool atOnly, bool escapeQuotes,
                              cmNewLineStyle newLine)
{
  int res = 1;
  if (!this->CanIWriteThisFile(outfile)) {
    cmSystemTools::Error("Attempt to write file: " + outfile +
                         " into a source directory.");
    return 0;
  }
  if (!cmSystemTools::FileExists(infile)) {
    cmSystemTools::Error("File " + infile + " does not exist.");
    return 0;
  }
  std::string soutfile = outfile;
  const std::string& sinfile = infile;
  this->AddCMakeDependFile(sinfile);
  cmSystemTools::ConvertToUnixSlashes(soutfile);

  // Re-generate if non-temporary outputs are missing.
  // when we finalize the configuration we will remove all
  // output files that now don't exist.
  this->AddCMakeOutputFile(soutfile);

  mode_t perm = 0;
  cmSystemTools::GetPermissions(sinfile, perm);
  std::string::size_type pos = soutfile.rfind('/');
  if (pos != std::string::npos) {
    std::string path = soutfile.substr(0, pos);
    cmSystemTools::MakeDirectory(path);
  }

  if (copyonly) {
    if (!cmSystemTools::CopyFileIfDifferent(sinfile, soutfile)) {
      return 0;
    }
  } else {
    std::string newLineCharacters;
    std::ios::openmode omode = std::ios::out | std::ios::trunc;
    if (newLine.IsValid()) {
      newLineCharacters = newLine.GetCharacters();
      omode |= std::ios::binary;
    } else {
      newLineCharacters = "\n";
    }
    std::string tempOutputFile = soutfile;
    tempOutputFile += ".tmp";
    cmsys::ofstream fout(tempOutputFile.c_str(), omode);
    if (!fout) {
      cmSystemTools::Error("Could not open file for write in copy operation " +
                           tempOutputFile);
      cmSystemTools::ReportLastSystemError("");
      return 0;
    }
    cmsys::ifstream fin(sinfile.c_str());
    if (!fin) {
      cmSystemTools::Error("Could not open file for read in copy operation " +
                           sinfile);
      return 0;
    }

    cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
    if (bom != cmsys::FStream::BOM_None && bom != cmsys::FStream::BOM_UTF8) {
      std::ostringstream e;
      e << "File starts with a Byte-Order-Mark that is not UTF-8:\n  "
        << sinfile;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return 0;
    }
    // rewind to copy BOM to output file
    fin.seekg(0);

    // now copy input to output and expand variables in the
    // input file at the same time
    std::string inLine;
    std::string outLine;
    while (cmSystemTools::GetLineFromStream(fin, inLine)) {
      outLine.clear();
      this->ConfigureString(inLine, outLine, atOnly, escapeQuotes);
      fout << outLine << newLineCharacters;
    }
    // close the files before attempting to copy
    fin.close();
    fout.close();
    if (!cmSystemTools::CopyFileIfDifferent(tempOutputFile, soutfile)) {
      res = 0;
    } else {
      cmSystemTools::SetPermissions(soutfile, perm);
    }
    cmSystemTools::RemoveFile(tempOutputFile);
  }
  return res;
}